

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db_00;
  code *xDel;
  undefined1 auStack_128 [4];
  int wd;
  DateTime y;
  int iStack_f0;
  int nDay;
  double s;
  char zBuf [100];
  char *zFmt;
  sqlite3 *db;
  char *z;
  size_t j;
  size_t i;
  u64 n;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  if (argc == 0) {
    return;
  }
  x._40_8_ = argv;
  register0x00000000 = sqlite3_value_text(*argv);
  if (register0x00000000 == (uchar *)0x0) {
    return;
  }
  iVar1 = isDate(context,argc + -1,(sqlite3_value **)(x._40_8_ + 8),(DateTime *)&n);
  if (iVar1 != 0) {
    return;
  }
  db_00 = sqlite3_context_db_handle(context);
  i = 1;
  for (j = 0; stack0xffffffffffffff80[j] != '\0'; j = j + 1) {
    if (stack0xffffffffffffff80[j] == '%') {
      switch(stack0xffffffffffffff80[j + 1]) {
      default:
        return;
      case 'H':
      case 'M':
      case 'S':
      case 'W':
      case 'd':
      case 'm':
        i = i + 1;
      case '%':
      case 'w':
        break;
      case 'J':
      case 's':
        i = i + 0x32;
        break;
      case 'Y':
        i = i + 8;
        break;
      case 'f':
        i = i + 8;
        break;
      case 'j':
        i = i + 3;
      }
      j = j + 1;
    }
    i = i + 1;
  }
  if (i < 100) {
    db = (sqlite3 *)&s;
  }
  else {
    if ((ulong)(long)db_00->aLimit[0] < i) {
      sqlite3_result_error_toobig(context);
      return;
    }
    db = (sqlite3 *)sqlite3DbMallocRawNN(db_00,(long)(int)i);
    if (db == (sqlite3 *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD((DateTime *)&n);
  computeYMD_HMS((DateTime *)&n);
  z = (char *)0x0;
  for (j = 0; stack0xffffffffffffff80[j] != '\0'; j = j + 1) {
    if (stack0xffffffffffffff80[j] == '%') {
      j = j + 1;
      switch(stack0xffffffffffffff80[j]) {
      case 'H':
        sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",(ulong)(uint)x.M);
        z = z + 2;
        break;
      default:
        z[(long)(db->aLimit + -0x1c)] = '%';
        z = z + 1;
        break;
      case 'J':
        sqlite3_snprintf(0x14,z + (long)(db->aLimit + -0x1c),"%.16g",(double)(long)n / 86400000.0);
        iVar1 = sqlite3Strlen30(z + (long)(db->aLimit + -0x1c));
        z = z + iVar1;
        break;
      case 'M':
        sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",(ulong)(uint)x.D);
        z = z + 2;
        break;
      case 'S':
        sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",(ulong)(uint)(int)(double)x._24_8_)
        ;
        z = z + 2;
        break;
      case 'W':
      case 'j':
        memcpy(auStack_128,&n,0x30);
        y.s._0_1_ = 0;
        y.iJD._4_4_ = 1;
        y.Y = 1;
        computeJD((DateTime *)auStack_128);
        y._44_4_ = SUB84((long)((n - _auStack_128) + 43200000) / 86400000,0);
        if (stack0xffffffffffffff80[j] == 'W') {
          sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",
                           (long)((y._44_4_ + 7) - (int)(((long)(n + 43200000) / 86400000) % 7)) / 7
                           & 0xffffffff);
          z = z + 2;
        }
        else {
          sqlite3_snprintf(4,z + (long)(db->aLimit + -0x1c),"%03d",(ulong)(y._44_4_ + 1));
          z = z + 3;
        }
        break;
      case 'Y':
        sqlite3_snprintf(5,z + (long)(db->aLimit + -0x1c),"%04d",(ulong)(uint)x.iJD);
        iVar1 = sqlite3Strlen30(z + (long)(db->aLimit + -0x1c));
        z = z + iVar1;
        break;
      case 'd':
        sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",(ulong)(uint)x.Y);
        z = z + 2;
        break;
      case 'f':
        iStack_f0 = x.m;
        nDay = x.tz;
        if (59.999 < (double)x._24_8_) {
          iStack_f0 = 0x3b645a1d;
          nDay = 0x404dffdf;
        }
        sqlite3_snprintf(7,z + (long)(db->aLimit + -0x1c),"%06.3f",_iStack_f0);
        iVar1 = sqlite3Strlen30(z + (long)(db->aLimit + -0x1c));
        z = z + iVar1;
        break;
      case 'm':
        sqlite3_snprintf(3,z + (long)(db->aLimit + -0x1c),"%02d",(ulong)x.iJD._4_4_);
        z = z + 2;
        break;
      case 's':
        sqlite3_snprintf(0x1e,z + (long)(db->aLimit + -0x1c),"%lld",(long)n / 1000 + -0x3118a36940);
        iVar1 = sqlite3Strlen30(z + (long)(db->aLimit + -0x1c));
        z = z + iVar1;
        break;
      case 'w':
        z[(long)(db->aLimit + -0x1c)] = (char)(((long)(n + 0x7b98a00) / 86400000) % 7) + '0';
        z = z + 1;
      }
    }
    else {
      z[(long)(db->aLimit + -0x1c)] = stack0xffffffffffffff80[j];
      z = z + 1;
    }
  }
  z[(long)(db->aLimit + -0x1c)] = '\0';
  xDel = sqlite3MallocSize;
  if (db == (sqlite3 *)&s) {
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
  }
  sqlite3_result_text(context,(char *)db,-1,xDel);
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  u64 n;
  size_t i,j;
  char *z;
  sqlite3 *db;
  const char *zFmt;
  char zBuf[100];
  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  for(i=0, n=1; zFmt[i]; i++, n++){
    if( zFmt[i]=='%' ){
      switch( zFmt[i+1] ){
        case 'd':
        case 'H':
        case 'm':
        case 'M':
        case 'S':
        case 'W':
          n++;
          /* fall thru */
        case 'w':
        case '%':
          break;
        case 'f':
          n += 8;
          break;
        case 'j':
          n += 3;
          break;
        case 'Y':
          n += 8;
          break;
        case 's':
        case 'J':
          n += 50;
          break;
        default:
          return;  /* ERROR.  return a NULL */
      }
      i++;
    }
  }
  testcase( n==sizeof(zBuf)-1 );
  testcase( n==sizeof(zBuf) );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH] );
  if( n<sizeof(zBuf) ){
    z = zBuf;
  }else if( n>(u64)db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    return;
  }else{
    z = sqlite3DbMallocRawNN(db, (int)n);
    if( z==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ){
      z[j++] = zFmt[i];
    }else{
      i++;
      switch( zFmt[i] ){
        case 'd':  sqlite3_snprintf(3, &z[j],"%02d",x.D); j+=2; break;
        case 'f': {
          double s = x.s;
          if( s>59.999 ) s = 59.999;
          sqlite3_snprintf(7, &z[j],"%06.3f", s);
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'H':  sqlite3_snprintf(3, &z[j],"%02d",x.h); j+=2; break;
        case 'W': /* Fall thru */
        case 'j': {
          int nDay;             /* Number of days since 1st day of year */
          DateTime y = x;
          y.validJD = 0;
          y.M = 1;
          y.D = 1;
          computeJD(&y);
          nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
          if( zFmt[i]=='W' ){
            int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
            wd = (int)(((x.iJD+43200000)/86400000)%7);
            sqlite3_snprintf(3, &z[j],"%02d",(nDay+7-wd)/7);
            j += 2;
          }else{
            sqlite3_snprintf(4, &z[j],"%03d",nDay+1);
            j += 3;
          }
          break;
        }
        case 'J': {
          sqlite3_snprintf(20, &z[j],"%.16g",x.iJD/86400000.0);
          j+=sqlite3Strlen30(&z[j]);
          break;
        }
        case 'm':  sqlite3_snprintf(3, &z[j],"%02d",x.M); j+=2; break;
        case 'M':  sqlite3_snprintf(3, &z[j],"%02d",x.m); j+=2; break;
        case 's': {
          sqlite3_snprintf(30,&z[j],"%lld",
                           (i64)(x.iJD/1000 - 21086676*(i64)10000));
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'S':  sqlite3_snprintf(3,&z[j],"%02d",(int)x.s); j+=2; break;
        case 'w': {
          z[j++] = (char)(((x.iJD+129600000)/86400000) % 7) + '0';
          break;
        }
        case 'Y': {
          sqlite3_snprintf(5,&z[j],"%04d",x.Y); j+=sqlite3Strlen30(&z[j]);
          break;
        }
        default:   z[j++] = '%'; break;
      }
    }
  }
  z[j] = 0;
  sqlite3_result_text(context, z, -1,
                      z==zBuf ? SQLITE_TRANSIENT : SQLITE_DYNAMIC);
}